

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O3

void __thiscall glslang::TParseContext::finish(TParseContext *this)

{
  EProfile EVar1;
  TInputScanner *pTVar2;
  TIntermediate *pTVar3;
  uint uVar4;
  EShLanguage EVar5;
  int iVar6;
  pointer ppTVar7;
  _func_int **pp_Var8;
  uint uVar9;
  TLayoutGeometry TVar10;
  undefined1 *puVar11;
  undefined **ppuVar12;
  undefined8 uVar13;
  TSourceLoc *pTVar14;
  char *pcVar15;
  ulong uVar16;
  
  TParseContextBase::finish(&this->super_TParseContextBase);
  if ((this->super_TParseContextBase).parsingBuiltins != false) {
    return;
  }
  ppTVar7 = (this->needsIndexLimitationChecking).
            super_vector<glslang::TIntermTyped_*,_glslang::pool_allocator<glslang::TIntermTyped_*>_>
            .
            super__Vector_base<glslang::TIntermTyped_*,_glslang::pool_allocator<glslang::TIntermTyped_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->needsIndexLimitationChecking).
      super_vector<glslang::TIntermTyped_*,_glslang::pool_allocator<glslang::TIntermTyped_*>_>.
      super__Vector_base<glslang::TIntermTyped_*,_glslang::pool_allocator<glslang::TIntermTyped_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppTVar7) {
    uVar16 = 0;
    do {
      constantIndexExpressionCheck(this,&ppTVar7[uVar16]->super_TIntermNode);
      uVar16 = uVar16 + 1;
      ppTVar7 = (this->needsIndexLimitationChecking).
                super_vector<glslang::TIntermTyped_*,_glslang::pool_allocator<glslang::TIntermTyped_*>_>
                .
                super__Vector_base<glslang::TIntermTyped_*,_glslang::pool_allocator<glslang::TIntermTyped_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar16 < (ulong)((long)(this->needsIndexLimitationChecking).
                                    super_vector<glslang::TIntermTyped_*,_glslang::pool_allocator<glslang::TIntermTyped_*>_>
                                    .
                                    super__Vector_base<glslang::TIntermTyped_*,_glslang::pool_allocator<glslang::TIntermTyped_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar7 >> 3)
            );
  }
  EVar5 = (this->super_TParseContextBase).super_TParseVersions.language;
  switch(EVar5) {
  case EShLangTessControl:
  case EShLangTessEvaluation:
    EVar1 = (this->super_TParseContextBase).super_TParseVersions.profile;
    iVar6 = (this->super_TParseContextBase).super_TParseVersions.version;
    if (iVar6 == 0x136 && EVar1 == EEsProfile) {
      pTVar2 = (this->super_TParseContextBase).super_TParseVersions.currentScanner;
      if (pTVar2->singleLogical == true) {
        pTVar14 = &pTVar2->logicalSourceLoc;
      }
      else {
        uVar9 = ~pTVar2->finale + pTVar2->numSources;
        if (pTVar2->currentSource <= (int)uVar9) {
          uVar9 = pTVar2->currentSource;
        }
        uVar4 = 0;
        if (0 < (int)uVar9) {
          uVar4 = uVar9;
        }
        pTVar14 = pTVar2->loc + uVar4;
      }
      pp_Var8 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      puVar11 = AEP_tessellation_shader;
      pcVar15 = "tessellation shaders";
      break;
    }
    if (iVar6 < 400 && EVar1 != EEsProfile) {
      pTVar2 = (this->super_TParseContextBase).super_TParseVersions.currentScanner;
      if (pTVar2->singleLogical == true) {
        pTVar14 = &pTVar2->logicalSourceLoc;
      }
      else {
        uVar9 = ~pTVar2->finale + pTVar2->numSources;
        if (pTVar2->currentSource <= (int)uVar9) {
          uVar9 = pTVar2->currentSource;
        }
        uVar4 = 0;
        if (0 < (int)uVar9) {
          uVar4 = uVar9;
        }
        pTVar14 = pTVar2->loc + uVar4;
      }
      pp_Var8 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      ppuVar12 = &E_GL_ARB_tessellation_shader;
      pcVar15 = "tessellation shaders";
      goto LAB_004b4534;
    }
    goto LAB_004b453f;
  case EShLangGeometry:
    if (((this->super_TParseContextBase).super_TParseVersions.profile != EEsProfile) ||
       ((this->super_TParseContextBase).super_TParseVersions.version != 0x136)) goto LAB_004b453f;
    pTVar2 = (this->super_TParseContextBase).super_TParseVersions.currentScanner;
    if (pTVar2->singleLogical == true) {
      pTVar14 = &pTVar2->logicalSourceLoc;
    }
    else {
      uVar9 = ~pTVar2->finale + pTVar2->numSources;
      if (pTVar2->currentSource <= (int)uVar9) {
        uVar9 = pTVar2->currentSource;
      }
      uVar4 = 0;
      if (0 < (int)uVar9) {
        uVar4 = uVar9;
      }
      pTVar14 = pTVar2->loc + uVar4;
    }
    pp_Var8 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    puVar11 = AEP_geometry_shader;
    pcVar15 = "geometry shaders";
    break;
  default:
    goto switchD_004b42e0_caseD_4;
  case EShLangCompute:
    if (((this->super_TParseContextBase).super_TParseVersions.profile == EEsProfile) ||
       (0x1ad < (this->super_TParseContextBase).super_TParseVersions.version)) goto LAB_004b453f;
    pTVar2 = (this->super_TParseContextBase).super_TParseVersions.currentScanner;
    if (pTVar2->singleLogical == true) {
      pTVar14 = &pTVar2->logicalSourceLoc;
    }
    else {
      uVar9 = ~pTVar2->finale + pTVar2->numSources;
      if (pTVar2->currentSource <= (int)uVar9) {
        uVar9 = pTVar2->currentSource;
      }
      uVar4 = 0;
      if (0 < (int)uVar9) {
        uVar4 = uVar9;
      }
      pTVar14 = pTVar2->loc + uVar4;
    }
    pp_Var8 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    ppuVar12 = &E_GL_ARB_compute_shader;
    pcVar15 = "compute shaders";
LAB_004b4534:
    uVar13 = 1;
    puVar11 = (undefined1 *)ppuVar12;
    goto LAB_004b453c;
  case EShLangTask:
    pTVar2 = (this->super_TParseContextBase).super_TParseVersions.currentScanner;
    if (pTVar2->singleLogical == true) {
      pTVar14 = &pTVar2->logicalSourceLoc;
    }
    else {
      uVar9 = ~pTVar2->finale + pTVar2->numSources;
      if (pTVar2->currentSource <= (int)uVar9) {
        uVar9 = pTVar2->currentSource;
      }
      uVar4 = 0;
      if (0 < (int)uVar9) {
        uVar4 = uVar9;
      }
      pTVar14 = pTVar2->loc + uVar4;
    }
    pp_Var8 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    puVar11 = AEP_mesh_shader;
    pcVar15 = "task shaders";
    break;
  case EShLangMesh:
    pTVar2 = (this->super_TParseContextBase).super_TParseVersions.currentScanner;
    if (pTVar2->singleLogical == true) {
      pTVar14 = &pTVar2->logicalSourceLoc;
    }
    else {
      uVar9 = ~pTVar2->finale + pTVar2->numSources;
      if (pTVar2->currentSource <= (int)uVar9) {
        uVar9 = pTVar2->currentSource;
      }
      uVar4 = 0;
      if (0 < (int)uVar9) {
        uVar4 = uVar9;
      }
      pTVar14 = pTVar2->loc + uVar4;
    }
    pp_Var8 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    puVar11 = AEP_mesh_shader;
    pcVar15 = "mesh shaders";
  }
  uVar13 = 2;
LAB_004b453c:
  (*pp_Var8[5])(this,pTVar14,uVar13,puVar11,pcVar15);
LAB_004b453f:
  EVar5 = (this->super_TParseContextBase).super_TParseVersions.language;
switchD_004b42e0_caseD_4:
  if (EVar5 != EShLangGeometry) {
    return;
  }
  iVar6 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                    (this,"GL_NV_geometry_shader_passthrough");
  if ((char)iVar6 == '\0') {
    return;
  }
  pTVar3 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
  if (pTVar3->outputPrimitive == ElgNone) {
    TVar10 = pTVar3->inputPrimitive;
    if (TVar10 != ElgPoints) {
      if (TVar10 == ElgTriangles) {
        TVar10 = ElgTriangleStrip;
      }
      else {
        if (TVar10 != ElgLines) goto LAB_004b458f;
        TVar10 = ElgLineStrip;
      }
    }
    pTVar3->outputPrimitive = TVar10;
  }
LAB_004b458f:
  if (pTVar3->vertices == -1) {
    TVar10 = pTVar3->inputPrimitive;
    if (1 < TVar10 - ElgPoints) {
      if (TVar10 != ElgTriangles) {
        return;
      }
      TVar10 = ElgLinesAdjacency;
    }
    pTVar3->vertices = TVar10;
  }
  return;
}

Assistant:

void TParseContext::finish()
{
    TParseContextBase::finish();

    if (parsingBuiltins)
        return;

    // Check on array indexes for ES 2.0 (version 100) limitations.
    for (size_t i = 0; i < needsIndexLimitationChecking.size(); ++i)
        constantIndexExpressionCheck(needsIndexLimitationChecking[i]);

    // Check for stages that are enabled by extension.
    // Can't do this at the beginning, it is chicken and egg to add a stage by
    // extension.
    // Stage-specific features were correctly tested for already, this is just
    // about the stage itself.
    switch (language) {
    case EShLangGeometry:
        if (isEsProfile() && version == 310)
            requireExtensions(getCurrentLoc(), Num_AEP_geometry_shader, AEP_geometry_shader, "geometry shaders");
        break;
    case EShLangTessControl:
    case EShLangTessEvaluation:
        if (isEsProfile() && version == 310)
            requireExtensions(getCurrentLoc(), Num_AEP_tessellation_shader, AEP_tessellation_shader, "tessellation shaders");
        else if (!isEsProfile() && version < 400)
            requireExtensions(getCurrentLoc(), 1, &E_GL_ARB_tessellation_shader, "tessellation shaders");
        break;
    case EShLangCompute:
        if (!isEsProfile() && version < 430)
            requireExtensions(getCurrentLoc(), 1, &E_GL_ARB_compute_shader, "compute shaders");
        break;
    case EShLangTask:
        requireExtensions(getCurrentLoc(), Num_AEP_mesh_shader, AEP_mesh_shader, "task shaders");
        break;
    case EShLangMesh:
        requireExtensions(getCurrentLoc(), Num_AEP_mesh_shader, AEP_mesh_shader, "mesh shaders");
        break;
    default:
        break;
    }

    // Set default outputs for GL_NV_geometry_shader_passthrough
    if (language == EShLangGeometry && extensionTurnedOn(E_SPV_NV_geometry_shader_passthrough)) {
        if (intermediate.getOutputPrimitive() == ElgNone) {
            switch (intermediate.getInputPrimitive()) {
            case ElgPoints:      intermediate.setOutputPrimitive(ElgPoints);    break;
            case ElgLines:       intermediate.setOutputPrimitive(ElgLineStrip); break;
            case ElgTriangles:   intermediate.setOutputPrimitive(ElgTriangleStrip); break;
            default: break;
            }
        }
        if (intermediate.getVertices() == TQualifier::layoutNotSet) {
            switch (intermediate.getInputPrimitive()) {
            case ElgPoints:      intermediate.setVertices(1); break;
            case ElgLines:       intermediate.setVertices(2); break;
            case ElgTriangles:   intermediate.setVertices(3); break;
            default: break;
            }
        }
    }
}